

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O3

int X509_VERIFY_PARAM_add0_policy(X509_VERIFY_PARAM *param,ASN1_OBJECT *policy)

{
  OPENSSL_STACK *sk;
  size_t sVar1;
  
  sk = *(OPENSSL_STACK **)&param->purpose;
  if (sk == (OPENSSL_STACK *)0x0) {
    sk = OPENSSL_sk_new_null();
    *(OPENSSL_STACK **)&param->purpose = sk;
    if (sk == (OPENSSL_STACK *)0x0) {
      return 0;
    }
  }
  sVar1 = OPENSSL_sk_push(sk,policy);
  return (uint)(sVar1 != 0);
}

Assistant:

int X509_VERIFY_PARAM_add0_policy(X509_VERIFY_PARAM *param,
                                  ASN1_OBJECT *policy) {
  if (!param->policies) {
    param->policies = sk_ASN1_OBJECT_new_null();
    if (!param->policies) {
      return 0;
    }
  }
  if (!sk_ASN1_OBJECT_push(param->policies, policy)) {
    return 0;
  }
  return 1;
}